

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,decimal_fp<float> *fp,
          basic_format_specs<char8_t> *specs,float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  byte bVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar3;
  byte *pbVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  size_t sVar12;
  bool bVar13;
  char8_t decimal_point;
  char8_t zero;
  bool pointy;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  int num_zeros;
  anon_class_28_8_ad0ecca5 write;
  undefined1 local_ca [2];
  uint local_c8;
  int local_c4;
  undefined1 local_c0 [12];
  sign_t local_b4;
  undefined1 local_b0 [8];
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  char local_88;
  basic_format_specs<char8_t> *local_80;
  undefined1 local_78 [8];
  undefined8 local_70;
  undefined8 local_68;
  decimal_fp<float> *local_60;
  digit_grouping<char8_t> *local_58;
  digit_grouping<char8_t> *local_50;
  uint *local_48;
  uint *local_40;
  char8_t *local_38;
  
  local_b0._0_4_ = fp->significand;
  uVar8 = 0x1f;
  if ((local_b0._0_4_ | 1) != 0) {
    for (; (local_b0._0_4_ | 1) >> uVar8 == 0; uVar8 = uVar8 - 1) {
    }
  }
  uVar5 = (ulong)(uint)local_b0._0_4_ +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar8 * 8);
  local_c4 = (int)(uVar5 >> 0x20);
  local_ca[1] = 0x30;
  local_c0._4_4_ = fspecs._4_4_;
  local_b4 = (uint)local_c0._4_4_ >> 8 & 0xff;
  fVar1 = fspecs;
  if ((long)uVar5 < 0) goto LAB_00180a58;
  bVar13 = local_b4 != none;
  local_ca[0] = '.';
  uVar8 = (uint)local_c0._4_4_ >> 0x11;
  local_c0._0_8_ = fspecs;
  if ((uVar8 & 1) != 0) {
    local_ca[0] = fmt::v8::detail::decimal_point_impl<char>(loc);
  }
  lVar11 = (ulong)bVar13 + (uVar5 >> 0x20);
  uVar8 = fp->exponent;
  local_b0._4_4_ = local_c4 + uVar8;
  iVar9 = (int)local_c0._0_8_;
  if (SUB81(local_c0._0_8_,4) == '\x01') {
LAB_001806e9:
    iVar10 = uVar8 + local_c4 + -1;
    if (((uint)local_c0._4_4_ >> 0x14 & 1) == 0) {
      uVar5 = 0;
      if (local_c4 == 1) {
        local_ca[0] = '\0';
      }
    }
    else {
      uVar5 = 0;
      if (0 < iVar9 - local_c4) {
        uVar5 = (ulong)(uint)(iVar9 - local_c4);
      }
      lVar11 = lVar11 + uVar5;
    }
    local_78._4_4_ = local_b0._0_4_;
    local_78._0_4_ = local_b4;
    local_70._0_5_ = CONCAT14(local_ca[0],local_c4);
    local_68._0_5_ = CONCAT14('0',(int)uVar5);
    local_68 = (bool *)(CONCAT26(local_68._6_2_,
                                 CONCAT15((((uint)local_c0._4_4_ >> 0x10 & 1) == 0) << 5,
                                          (undefined5)local_68)) | 0x450000000000);
    local_60 = (decimal_fp<float> *)CONCAT44(local_60._4_4_,iVar10);
    if (specs->width < 1) {
      bVar3 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char8_t,_fmt::v8::detail::digit_grouping<char8_t>_>
              ::anon_class_28_8_ad0ecca5::operator()
                        ((anon_class_28_8_ad0ecca5 *)local_78,out.container);
    }
    else {
      if ((int)local_b0._4_4_ < 1) {
        iVar10 = 1 - local_b0._4_4_;
      }
      lVar6 = 2;
      if (99 < iVar10) {
        lVar6 = (ulong)(999 < iVar10) + 3;
      }
      sVar12 = lVar11 + lVar6 + (3 - (ulong)(local_ca[0] == '\0'));
      bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,sVar12,sVar12,(anon_class_28_8_ad0ecca5 *)local_78);
    }
  }
  else {
    if ((local_c0._0_8_ & 0xff00000000) == 0) {
      iVar10 = 0x10;
      if (0 < iVar9) {
        iVar10 = iVar9;
      }
      if (((int)local_b0._4_4_ < -3) || (iVar10 < (int)local_b0._4_4_)) goto LAB_001806e9;
    }
    if ((int)uVar8 < 0) {
      if ((int)local_b0._4_4_ < 1) {
        iVar10 = -local_b0._4_4_;
        local_a8._0_4_ = iVar10;
        if (SBORROW4(iVar9,iVar10) != iVar9 + local_b0._4_4_ < 0) {
          local_a8._0_4_ = iVar9;
        }
        if (iVar9 < 0) {
          local_a8._0_4_ = iVar10;
        }
        if (local_c4 != 0) {
          local_a8._0_4_ = iVar10;
        }
        bVar2 = 1;
        if (local_c4 == 0 && local_a8._0_4_ == 0) {
          bVar2 = (local_c0[6] & 0x10) >> 4;
        }
        local_c8 = CONCAT31(local_c8._1_3_,bVar2);
        fVar1 = (float_specs)local_c0._0_8_;
        if (-1 < (int)local_a8._0_4_) {
          sVar12 = lVar11 + (ulong)((uint)bVar2 + local_a8._0_4_ + 1);
          local_78 = (undefined1  [8])&local_b4;
          local_70 = (significand_type *)(local_ca + 1);
          local_68 = (bool *)&local_c8;
          local_60 = (decimal_fp<float> *)local_ca;
          local_58 = (digit_grouping<char8_t> *)local_a8;
          local_50 = (digit_grouping<char8_t> *)local_b0;
          local_48 = (uint *)&local_c4;
          bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_&>
                            (out,specs,sVar12,sVar12,(anon_class_56_7_162c6e41 *)local_78);
          return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar3.container;
        }
LAB_00180a58:
        local_c0._0_8_ = fVar1;
        fmt::v8::detail::assert_fail
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                   ,0x195,"negative value");
      }
      iVar10 = 0;
      local_c8 = iVar9 - local_c4 & (int)(local_c0._4_4_ << 0xb) >> 0x1f;
      uVar8 = local_c8;
      if ((int)local_c8 < 1) {
        uVar8 = 0;
      }
      local_80 = specs;
      digit_grouping<char8_t>::digit_grouping
                ((digit_grouping<char8_t> *)local_a8,loc,
                 (bool)((byte)((uint)local_c0._4_4_ >> 0x11) & 1));
      pbVar4 = (byte *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      pbVar7 = pbVar4 + local_a8._8_8_;
      sVar12 = (ulong)uVar8 + (uVar5 >> 0x20) + (ulong)bVar13;
      do {
        iVar9 = 0x7fffffff;
        if (local_88 != '\0') {
          if (pbVar4 == pbVar7) {
            uVar8 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar2 = *pbVar4;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_0018092a;
            pbVar4 = pbVar4 + 1;
            uVar8 = (uint)bVar2;
          }
          iVar10 = iVar10 + uVar8;
          iVar9 = iVar10;
        }
LAB_0018092a:
        sVar12 = sVar12 + 1;
      } while (iVar9 < local_c4);
      local_78 = (undefined1  [8])&local_b4;
      local_70 = (significand_type *)local_b0;
      local_68 = (bool *)&local_c4;
      local_60 = (decimal_fp<float> *)(local_b0 + 4);
      local_58 = (digit_grouping<char8_t> *)local_ca;
      local_48 = &local_c8;
      local_40 = (uint *)(local_ca + 1);
      local_50 = (digit_grouping<char8_t> *)local_a8;
      bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_&>
                        (out,local_80,sVar12,sVar12,(anon_class_64_8_e6ffa566 *)local_78);
    }
    else {
      lVar11 = lVar11 + (ulong)uVar8;
      local_c8 = iVar9 - local_b0._4_4_;
      if (((uint)local_c0._4_4_ >> 0x14 & 1) != 0) {
        if (SUB81(local_c0._0_8_,4) != '\x02' && (int)local_c8 < 1) {
          local_c8 = 1;
        }
        if (0 < (int)local_c8) {
          lVar11 = lVar11 + (ulong)local_c8 + 1;
        }
      }
      digit_grouping<char8_t>::digit_grouping
                ((digit_grouping<char8_t> *)local_a8,loc,
                 (bool)((byte)((uint)local_c0._4_4_ >> 0x11) & 1));
      pbVar4 = (byte *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      pbVar7 = pbVar4 + local_a8._8_8_;
      sVar12 = lVar11 - 1;
      iVar9 = 0;
      do {
        iVar10 = 0x7fffffff;
        if (local_88 != '\0') {
          if (pbVar4 == pbVar7) {
            uVar8 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar2 = *pbVar4;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_0018081f;
            pbVar4 = pbVar4 + 1;
            uVar8 = (uint)bVar2;
          }
          iVar9 = iVar9 + uVar8;
          iVar10 = iVar9;
        }
LAB_0018081f:
        sVar12 = sVar12 + 1;
      } while (iVar10 < local_c4);
      local_78 = (undefined1  [8])&local_b4;
      local_70 = (significand_type *)local_b0;
      local_68 = (bool *)&local_c4;
      local_50 = (digit_grouping<char8_t> *)local_c0;
      local_48 = (uint *)local_ca;
      local_40 = &local_c8;
      local_38 = local_ca + 1;
      local_60 = fp;
      local_58 = (digit_grouping<char8_t> *)local_a8;
      bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_&>
                        (out,specs,sVar12,sVar12,(anon_class_72_9_d68ba176 *)local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a8._4_4_,local_a8._0_4_) != &local_98) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_a8._4_4_,local_a8._0_4_),local_98._M_allocated_capacity + 1)
      ;
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}